

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

int logmath_add(logmath_t *lmath,int logb_x,int logb_y)

{
  uint8 uVar1;
  int local_30;
  int local_2c;
  int r;
  int d;
  logadd_t *t;
  int logb_y_local;
  int logb_x_local;
  logmath_t *lmath_local;
  
  lmath_local._4_4_ = logb_y;
  if ((lmath->zero < logb_x) && (lmath_local._4_4_ = logb_x, lmath->zero < logb_y)) {
    if ((lmath->t).table == (void *)0x0) {
      lmath_local._4_4_ = logmath_add_exact(lmath,logb_x,logb_y);
    }
    else {
      if (logb_y < logb_x) {
        local_2c = logb_x - logb_y;
        local_30 = logb_x;
      }
      else {
        local_2c = logb_y - logb_x;
        local_30 = logb_y;
      }
      if (local_2c < 0) {
        lmath_local._4_4_ = local_30;
      }
      else if ((ulong)(long)local_2c < (ulong)(lmath->t).table_size) {
        uVar1 = (lmath->t).width;
        if (uVar1 == '\x01') {
          lmath_local._4_4_ = local_30 + (uint)*(byte *)((long)(lmath->t).table + (long)local_2c);
        }
        else if (uVar1 == '\x02') {
          lmath_local._4_4_ =
               local_30 + (uint)*(ushort *)((long)(lmath->t).table + (long)local_2c * 2);
        }
        else if (uVar1 == '\x04') {
          lmath_local._4_4_ = local_30 + *(int *)((long)(lmath->t).table + (long)local_2c * 4);
        }
        else {
          lmath_local._4_4_ = local_30;
        }
      }
      else {
        lmath_local._4_4_ = local_30;
      }
    }
  }
  return lmath_local._4_4_;
}

Assistant:

int
logmath_add(logmath_t *lmath, int logb_x, int logb_y)
{
    logadd_t *t = LOGMATH_TABLE(lmath);
    int d, r;

    /* handle 0 + x = x case. */
    if (logb_x <= lmath->zero)
        return logb_y;
    if (logb_y <= lmath->zero)
        return logb_x;

    if (t->table == NULL)
        return logmath_add_exact(lmath, logb_x, logb_y);

    /* d must be positive, obviously. */
    if (logb_x > logb_y) {
        d = (logb_x - logb_y);
        r = logb_x;
    }
    else {
        d = (logb_y - logb_x);
        r = logb_y;
    }

    if (d < 0) {
        /* Some kind of overflow has occurred, fail gracefully. */
        return r;
    }
    if ((size_t)d >= t->table_size) {
        /* If this happens, it's not actually an error, because the
         * last entry in the logadd table is guaranteed to be zero.
         * Therefore we just return the larger of the two values. */
        return r;
    }

    switch (t->width) {
    case 1:
        return r + (((uint8 *)t->table)[d]);
    case 2:
        return r + (((uint16 *)t->table)[d]);
    case 4:
        return r + (((uint32 *)t->table)[d]);
    }
    return r;
}